

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto_ExtensionRange::SerializeWithCachedSizes
          (DescriptorProto_ExtensionRange *this,CodedOutputStream *output)

{
  bool bVar1;
  int32 iVar2;
  UnknownFieldSet *pUVar3;
  CodedOutputStream *output_local;
  DescriptorProto_ExtensionRange *this_local;
  
  bVar1 = has_start(this);
  if (bVar1) {
    iVar2 = start(this);
    internal::WireFormatLite::WriteInt32(1,iVar2,output);
  }
  bVar1 = has_end(this);
  if (bVar1) {
    iVar2 = end(this);
    internal::WireFormatLite::WriteInt32(2,iVar2,output);
  }
  pUVar3 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar3,output);
  }
  return;
}

Assistant:

void DescriptorProto_ExtensionRange::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional int32 start = 1;
  if (has_start()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->start(), output);
  }

  // optional int32 end = 2;
  if (has_end()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(2, this->end(), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}